

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O0

void __thiscall UnitTestBase::UnitTestBase(UnitTestBase *this)

{
  UnitTestManager *in_RDI;
  UnitTestBase *test;
  
  (in_RDI->all_).super__Vector_base<UnitTestBase_*,_std::allocator<UnitTestBase_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR___cxa_pure_virtual_00268830;
  test = (UnitTestBase *)
         &(in_RDI->all_).super__Vector_base<UnitTestBase_*,_std::allocator<UnitTestBase_*>_>._M_impl
          .super__Vector_impl_data._M_finish;
  std::__cxx11::string::string((string *)test);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1ca38d);
  UnitTestManager::GetInstance();
  UnitTestManager::AddUnitTest(in_RDI,test);
  return;
}

Assistant:

UnitTestBase::UnitTestBase()
{
    UnitTestManager::GetInstance().AddUnitTest(this);
}